

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

rt_constant<double,_viennamath::rt_expression_interface<double>_> __thiscall
viennamath::rt_variable<viennamath::rt_expression_interface<double>>::operator()
          (rt_variable<viennamath::rt_expression_interface<double>> *this,
          rt_constant<double,_viennamath::rt_expression_interface<double>_> *other)

{
  variable_index_out_of_bounds_exception *this_00;
  rt_constant *in_RDX;
  double s_;
  double extraout_XMM0_Qa;
  rt_constant<double,_viennamath::rt_expression_interface<double>_> rVar1;
  rt_constant<double,_viennamath::rt_expression_interface<double>_> *other_local;
  rt_variable<viennamath::rt_expression_interface<double>_> *this_local;
  
  if (other->s != 0.0) {
    this_00 = (variable_index_out_of_bounds_exception *)__cxa_allocate_exception(0x18);
    variable_index_out_of_bounds_exception::variable_index_out_of_bounds_exception
              (this_00,(long)other->s,0);
    __cxa_throw(this_00,&variable_index_out_of_bounds_exception::typeinfo,
                variable_index_out_of_bounds_exception::~variable_index_out_of_bounds_exception);
  }
  s_ = rt_constant::operator_cast_to_double(in_RDX);
  rt_constant<double,_viennamath::rt_expression_interface<double>_>::rt_constant
            ((rt_constant<double,_viennamath::rt_expression_interface<double>_> *)this,s_);
  rVar1.s = extraout_XMM0_Qa;
  rVar1.super_rt_expression_interface<double>._vptr_rt_expression_interface = (_func_int **)this;
  return rVar1;
}

Assistant:

rt_constant<ScalarType> operator()(rt_constant<ScalarType> const & other) const
      {
        if (id_ > 0)
          throw variable_index_out_of_bounds_exception(static_cast<long>(id_), 0);
        return rt_constant<ScalarType>(static_cast<ScalarType>(other));
      }